

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SerializedResourceSignatureImpl.cpp
# Opt level: O0

bool __thiscall
Diligent::SerializedResourceSignatureImpl::IsCompatible
          (SerializedResourceSignatureImpl *this,SerializedResourceSignatureImpl *Rhs,
          ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags)

{
  type DeviceFlag;
  DeviceType Type;
  uint uVar1;
  IPipelineResourceSignature *pIVar2;
  IPipelineResourceSignature *pIVar3;
  IPipelineResourceSignature *pPRS1;
  IPipelineResourceSignature *pPRS0;
  DeviceType ArchiveDeviceType;
  type DataTypeFlag;
  ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags_local;
  SerializedResourceSignatureImpl *Rhs_local;
  SerializedResourceSignatureImpl *this_local;
  
  ArchiveDeviceType = DeviceFlags;
  _DataTypeFlag = Rhs;
  Rhs_local = this;
  while( true ) {
    if (ArchiveDeviceType == OpenGL) {
      return true;
    }
    DeviceFlag = ExtractLSB<Diligent::ARCHIVE_DEVICE_DATA_FLAGS>(&ArchiveDeviceType);
    Type = ArchiveDeviceDataFlagToArchiveDeviceType(DeviceFlag);
    pIVar2 = GetDeviceSignature(this,Type);
    pIVar3 = GetDeviceSignature(_DataTypeFlag,Type);
    if ((pIVar2 == (IPipelineResourceSignature *)0x0) !=
        (pIVar3 == (IPipelineResourceSignature *)0x0)) break;
    if (((pIVar2 != (IPipelineResourceSignature *)0x0) &&
        (pIVar3 != (IPipelineResourceSignature *)0x0)) &&
       (uVar1 = (*(pIVar2->super_IDeviceObject).super_IObject._vptr_IObject[0xf])(pIVar2,pIVar3),
       (uVar1 & 1) == 0)) {
      return false;
    }
  }
  return false;
}

Assistant:

bool SerializedResourceSignatureImpl::IsCompatible(const SerializedResourceSignatureImpl& Rhs, ARCHIVE_DEVICE_DATA_FLAGS DeviceFlags) const
{
    while (DeviceFlags != ARCHIVE_DEVICE_DATA_FLAG_NONE)
    {
        const auto DataTypeFlag      = ExtractLSB(DeviceFlags);
        const auto ArchiveDeviceType = ArchiveDeviceDataFlagToArchiveDeviceType(DataTypeFlag);

        const auto* pPRS0 = GetDeviceSignature(ArchiveDeviceType);
        const auto* pPRS1 = Rhs.GetDeviceSignature(ArchiveDeviceType);
        if ((pPRS0 == nullptr) != (pPRS1 == nullptr))
            return false;

        if ((pPRS0 != nullptr) && (pPRS1 != nullptr) && !pPRS0->IsCompatibleWith(pPRS1))
            return false;
    }
    return true;
}